

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::exit(App *this,int __status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  Error *__args_1;
  App *in_stack_fffffffffffffe20;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
  *in_stack_fffffffffffffe28;
  string local_168 [32];
  string local_148 [20];
  undefined4 in_stack_fffffffffffffecc;
  string *in_stack_fffffffffffffed0;
  App *in_stack_fffffffffffffed8;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  ostream *local_28;
  ostream *local_20;
  Error *local_18;
  App *local_10;
  
  local_18 = (Error *)CONCAT44(in_register_00000034,__status);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = this;
  Error::get_name_abi_cxx11_(in_stack_fffffffffffffe08);
  bVar1 = ::std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  ::std::__cxx11::string::~string(local_48);
  if (bVar1) {
    Error::get_exit_code(local_18);
  }
  else {
    Error::get_name_abi_cxx11_(in_stack_fffffffffffffe08);
    bVar1 = ::std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    ::std::__cxx11::string::~string(local_78);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"",&local_b9);
      help(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      ::std::operator<<(local_20,local_98);
      ::std::__cxx11::string::~string(local_98);
      ::std::__cxx11::string::~string(local_b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      Error::get_exit_code(local_18);
    }
    else {
      Error::get_name_abi_cxx11_(in_stack_fffffffffffffe08);
      bVar1 = ::std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
      ::std::__cxx11::string::~string(local_e0);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_120,"",(allocator *)&stack0xfffffffffffffedf);
        help(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        ::std::operator<<(local_20,local_100);
        ::std::__cxx11::string::~string(local_100);
        ::std::__cxx11::string::~string(local_120);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
        Error::get_exit_code(local_18);
      }
      else {
        Error::get_name_abi_cxx11_(in_stack_fffffffffffffe08);
        bVar1 = ::std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
        ::std::__cxx11::string::~string(local_148);
        if (bVar1) {
          pcVar3 = (char *)(**(code **)(*(long *)local_18 + 0x10))();
          poVar4 = ::std::operator<<(local_20,pcVar3);
          ::std::operator<<(poVar4,'\n');
          Error::get_exit_code(local_18);
        }
        else {
          iVar2 = Error::get_exit_code(local_18);
          if ((iVar2 != 0) &&
             (bVar1 = ::std::function::operator_cast_to_bool
                                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
                                  *)0x127dff), bVar1)) {
            __args_1 = (Error *)local_168;
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
            ::operator()(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,__args_1);
            poVar4 = ::std::operator<<(local_28,(string *)__args_1);
            ::std::ostream::operator<<(poVar4,::std::flush<char,std::char_traits<char>>);
            ::std::__cxx11::string::~string(local_168);
          }
          Error::get_exit_code(local_18);
        }
      }
    }
  }
  return;
}

Assistant:

CLI11_INLINE int App::exit(const Error &e, std::ostream &out, std::ostream &err) const {

    /// Avoid printing anything if this is a CLI::RuntimeError
    if(e.get_name() == "RuntimeError")
        return e.get_exit_code();

    if(e.get_name() == "CallForHelp") {
        out << help();
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForAllHelp") {
        out << help("", AppFormatMode::All);
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForVersion") {
        out << e.what() << '\n';
        return e.get_exit_code();
    }

    if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
        if(failure_message_)
            err << failure_message_(this, e) << std::flush;
    }

    return e.get_exit_code();
}